

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O1

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_vote_req(raft_server *this,req_msg *req)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  element_type *peVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pointer psVar8;
  bool bVar9;
  undefined8 *puVar10;
  undefined8 uVar11;
  long in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  undefined1 auVar13 [16];
  ptr<resp_msg> pVar14;
  long *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  ulong *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  peVar4 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar1 = *(undefined4 *)(in_RDX + 0x14);
  this->_vptr_raft_server = (_func_int **)0x0;
  puVar10 = (undefined8 *)operator_new(0x40);
  puVar10[1] = 0x100000001;
  *puVar10 = &PTR___Sp_counted_ptr_inplace_0017a728;
  uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
  puVar10[3] = peVar4;
  *(undefined4 *)(puVar10 + 4) = 2;
  *(undefined4 *)((long)puVar10 + 0x24) = uVar2;
  *(undefined4 *)(puVar10 + 5) = uVar1;
  puVar10[2] = &PTR__msg_base_0017a778;
  puVar10[6] = 0;
  *(undefined1 *)(puVar10 + 7) = 0;
  *(undefined8 **)&this->leader_ = puVar10;
  this->_vptr_raft_server = (_func_int **)(puVar10 + 2);
  uVar5 = *(ulong *)(in_RDX + 0x20);
  (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_40);
  uVar6 = *local_40;
  if (uVar6 < uVar5) {
    bVar9 = false;
    _Var12._M_pi = extraout_RDX;
  }
  else {
    lVar7 = *(long *)(in_RDX + 0x20);
    (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x20))(&local_50);
    bVar9 = true;
    _Var12._M_pi = extraout_RDX_00;
    if (lVar7 == *local_50) {
      auVar13 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      _Var12._M_pi = auVar13._8_8_;
      bVar9 = *(ulong *)(in_RDX + 0x28) < auVar13._0_8_ - 1U;
    }
  }
  if ((uVar5 <= uVar6) && (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    _Var12._M_pi = extraout_RDX_01;
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var12._M_pi = extraout_RDX_02;
  }
  psVar8 = req[3].log_entries_.
           super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((!bVar9 && *(element_type **)(in_RDX + 8) ==
                 (psVar8->super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr) &&
     ((iVar3 = *(int *)&(psVar8->
                        super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_refcount._M_pi, iVar3 == -1 || (iVar3 == *(int *)(in_RDX + 0x14))))) {
    uVar11 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    puVar10[6] = uVar11;
    *(undefined1 *)(puVar10 + 7) = 1;
    *(undefined4 *)
     &((req[3].log_entries_.
        super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         *(undefined4 *)(in_RDX + 0x14);
    (**(code **)(((((req->log_entries_).
                    super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 term_ + 0x20))();
    _Var12._M_pi = extraout_RDX_03;
  }
  pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var12._M_pi;
  pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar14.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_vote_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::vote_response, id_, req.get_src()));
    bool log_okay = req.get_last_log_term() > log_store_->last_entry()->get_term() ||
                    (req.get_last_log_term() == log_store_->last_entry()->get_term() &&
                     log_store_->next_slot() - 1 <= req.get_last_log_idx());
    bool grant = req.get_term() == state_->get_term() && log_okay &&
                 (state_->get_voted_for() == req.get_src() || state_->get_voted_for() == -1);
    if (grant)
    {
        resp->accept(log_store_->next_slot());
        state_->set_voted_for(req.get_src());
        ctx_->state_mgr_->save_state(*state_);
    }

    return resp;
}